

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# near_lossless_enc.c
# Opt level: O2

void NearLossless(int xsize,int ysize,uint32_t *argb_src,int stride,int limit_bits,
                 uint32_t *copy_buffer,uint32_t *argb_dst)

{
  size_t __n;
  uint32_t *__dest;
  int limit;
  int iVar1;
  int iVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  uint32_t *puVar10;
  long lVar11;
  uint32_t *local_90;
  uint32_t *local_78;
  
  local_78 = argb_dst;
  limit = 1 << ((byte)limit_bits & 0x1f);
  lVar11 = (long)xsize;
  __dest = copy_buffer + lVar11;
  __n = lVar11 * 4;
  memcpy(__dest,argb_src,__n);
  memcpy(__dest + lVar11,argb_src + stride,__n);
  iVar1 = ysize + -1;
  lVar7 = (long)(xsize + -1);
  if (ysize < 1) {
    ysize = 0;
  }
  iVar8 = 0;
  local_90 = __dest + lVar11;
  do {
    puVar10 = copy_buffer;
    copy_buffer = __dest;
    if (iVar8 == ysize) {
      return;
    }
    if (iVar8 == iVar1 || iVar8 == 0) {
      memcpy(local_78,argb_src,__n);
    }
    else {
      memcpy(local_90,argb_src + stride,__n);
      *local_78 = *argb_src;
      local_78[lVar7] = argb_src[lVar7];
      for (lVar9 = 1; lVar9 < lVar7; lVar9 = lVar9 + 1) {
        uVar6 = copy_buffer[lVar9];
        iVar2 = IsNear(uVar6,copy_buffer[lVar9 + -1],limit);
        if (iVar2 == 0) {
LAB_0013d857:
          uVar3 = FindClosestDiscretized(uVar6 >> 0x18,limit_bits);
          uVar4 = FindClosestDiscretized(uVar6 >> 0x10 & 0xff,limit_bits);
          uVar5 = FindClosestDiscretized(uVar6 >> 8 & 0xff,limit_bits);
          uVar6 = FindClosestDiscretized(uVar6 & 0xff,limit_bits);
          uVar6 = uVar6 | uVar5 << 8 | uVar4 << 0x10 | uVar3 << 0x18;
        }
        else {
          iVar2 = IsNear(uVar6,copy_buffer[lVar9 + 1],limit);
          if (iVar2 == 0) goto LAB_0013d857;
          iVar2 = IsNear(uVar6,puVar10[lVar9],limit);
          if (iVar2 == 0) goto LAB_0013d857;
          iVar2 = IsNear(uVar6,local_90[lVar9],limit);
          if (iVar2 == 0) goto LAB_0013d857;
        }
        local_78[lVar9] = uVar6;
      }
    }
    iVar8 = iVar8 + 1;
    argb_src = argb_src + stride;
    local_78 = local_78 + lVar11;
    __dest = local_90;
    local_90 = puVar10;
  } while( true );
}

Assistant:

static void NearLossless(int xsize, int ysize, const uint32_t* argb_src,
                         int stride, int limit_bits, uint32_t* copy_buffer,
                         uint32_t* argb_dst) {
  int x, y;
  const int limit = 1 << limit_bits;
  uint32_t* prev_row = copy_buffer;
  uint32_t* curr_row = prev_row + xsize;
  uint32_t* next_row = curr_row + xsize;
  memcpy(curr_row, argb_src, xsize * sizeof(argb_src[0]));
  memcpy(next_row, argb_src + stride, xsize * sizeof(argb_src[0]));

  for (y = 0; y < ysize; ++y, argb_src += stride, argb_dst += xsize) {
    if (y == 0 || y == ysize - 1) {
      memcpy(argb_dst, argb_src, xsize * sizeof(argb_src[0]));
    } else {
      memcpy(next_row, argb_src + stride, xsize * sizeof(argb_src[0]));
      argb_dst[0] = argb_src[0];
      argb_dst[xsize - 1] = argb_src[xsize - 1];
      for (x = 1; x < xsize - 1; ++x) {
        if (IsSmooth(prev_row, curr_row, next_row, x, limit)) {
          argb_dst[x] = curr_row[x];
        } else {
          argb_dst[x] = ClosestDiscretizedArgb(curr_row[x], limit_bits);
        }
      }
    }
    {
      // Three-way swap.
      uint32_t* const temp = prev_row;
      prev_row = curr_row;
      curr_row = next_row;
      next_row = temp;
    }
  }
}